

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O2

void chunkpool_free2(chunkpool *ctx,cb_free *f)

{
  int iVar1;
  long lVar2;
  
  iVar1 = ctx->chunk;
  while (-1 < iVar1) {
    if (f != (cb_free *)0x0) {
      iVar1 = ctx->chunk_pos;
      do {
        lVar2 = (long)iVar1 - (long)ctx->chunk_size;
        ctx->chunk_pos = (int)lVar2;
        (*f)((void *)(lVar2 + (long)ctx->chunks[ctx->chunk]));
        iVar1 = ctx->chunk_pos;
      } while (0 < iVar1);
      iVar1 = ctx->chunk;
      ctx->chunk_pos = ctx->chunk_max;
    }
    free(ctx->chunks[iVar1]);
    iVar1 = ctx->chunk + -1;
    ctx->chunk = iVar1;
  }
  ctx->chunk_size = -1;
  ctx->chunk_pos = -1;
  ctx->chunk_max = -1;
  return;
}

Assistant:

void
chunkpool_free2(struct chunkpool *ctx, cb_free *f)
{
    while(ctx->chunk >= 0)
    {
        if(f != NULL)
        {
            do
            {
                ctx->chunk_pos -= ctx->chunk_size;
                f((char*)ctx->chunks[ctx->chunk] + ctx->chunk_pos);
            }
            while(ctx->chunk_pos > 0);
            ctx->chunk_pos = ctx->chunk_max;
        }
	free(ctx->chunks[ctx->chunk]);
	ctx->chunk -= 1;
    }
    ctx->chunk_size = -1;
    ctx->chunk_max = -1;
    ctx->chunk_pos = -1;
}